

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O0

void __thiscall
amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>
::evalIntegrand(ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>
                *this,GpuArray<double,_3U> x,Real w)

{
  uint uVar1;
  long *in_RDI;
  double in_XMM0_Qa;
  Real RVar2;
  Real RVar3;
  Real RVar4;
  double dVar5;
  Real gw;
  int j_1;
  bool new_ok;
  int dim_1;
  int j;
  bool okay;
  int i_1;
  Real tol;
  Real xroot;
  Real phi_lo;
  int dim;
  int i;
  int nroots;
  Real x_max;
  Real x_min;
  GpuArray<double,_4U> roots;
  Real gauss_w [4];
  Real gauss_x [4];
  double c;
  undefined8 in_stack_fffffffffffffae0;
  int iVar6;
  bool local_515;
  int local_514;
  bool local_505;
  int local_504;
  int in_stack_fffffffffffffb08;
  uint in_stack_fffffffffffffb0c;
  BoundingBox<3> *this_00;
  int local_4d8;
  int local_4d0;
  int local_4cc;
  bool local_4c5;
  int local_4c4;
  int local_4a4;
  int local_4a0;
  int local_49c;
  Real local_488;
  double local_480;
  double local_478 [2];
  double local_468 [9];
  double local_420;
  int local_40c;
  long *local_408;
  int local_3fc;
  long *local_3f8;
  int local_3ec;
  long local_3e8;
  int local_3dc;
  long local_3d8;
  int local_3cc;
  long local_3c8;
  int local_3bc;
  long local_3b8;
  byte *local_3b0;
  byte *local_3a8;
  int local_39c;
  BoundingBox<3> *local_398;
  int local_38c;
  BoundingBox<3> *local_388;
  int local_37c;
  BoundingBox<3> *local_378;
  int local_36c;
  BoundingBox<3> *local_368;
  int local_35c;
  BoundingBox<3> *local_358;
  int local_34c;
  BoundingBox<3> *local_348;
  BoundingBox<3> *local_340;
  double *local_338;
  BoundingBox<3> *local_330;
  double *local_328;
  undefined4 local_31c;
  double *local_318;
  undefined4 local_30c;
  double *local_308;
  undefined4 local_2fc;
  BoundingBox<3> *local_2f8;
  undefined4 local_2ec;
  double *local_2e8;
  undefined4 local_2dc;
  double *local_2d8;
  undefined4 local_2cc;
  BoundingBox<3> *local_2c8;
  undefined4 local_2bc;
  double *local_2b8;
  undefined4 local_2ac;
  double *local_2a8;
  undefined4 local_29c;
  BoundingBox<3> *local_298;
  undefined4 local_28c;
  double *local_288;
  undefined4 local_27c;
  double *local_278;
  undefined4 local_26c;
  BoundingBox<3> *local_268;
  undefined4 local_25c;
  double *local_258;
  undefined4 local_24c;
  double *local_248;
  undefined4 local_23c;
  BoundingBox<3> *local_238;
  undefined4 local_22c;
  double *local_228;
  undefined4 local_21c;
  double *local_218;
  undefined4 local_20c;
  BoundingBox<3> *local_208;
  int local_1fc;
  long local_1f8;
  int local_1ec;
  long local_1e8;
  double local_1e0;
  BoundingBox<3> *local_1d8;
  int *local_1d0;
  undefined4 local_1c4;
  BoundingBox<3> *local_1c0;
  undefined4 local_1b4;
  BoundingBox<3> *local_1b0;
  undefined4 local_1a4;
  BoundingBox<3> *local_1a0;
  int local_194;
  int *local_190;
  int local_184;
  int *local_180;
  int local_174;
  int *local_170;
  int local_164;
  int *local_160;
  int local_154;
  Real *local_150;
  int local_144;
  Real *local_140;
  int local_134;
  Real *local_130;
  int local_124;
  Real *local_120;
  int local_114;
  Real *local_110;
  int local_104;
  Real *local_100;
  int local_f4;
  Real *local_f0;
  int local_e4;
  Real *local_e0;
  int local_d4;
  Real *local_d0;
  int local_c4;
  Real *local_c0;
  undefined4 local_b4;
  Real *local_b0;
  undefined4 local_a4;
  Real *local_a0;
  undefined4 local_94;
  Real *local_90;
  undefined4 local_84;
  Real *local_80;
  int local_74;
  Real *local_70;
  undefined4 local_64;
  Real *local_60;
  int local_54;
  long local_50;
  int local_44;
  long local_40;
  int local_34;
  long local_30;
  int local_24;
  long local_20;
  double local_18;
  double *local_10;
  double *local_8;
  
  this_00 = (BoundingBox<3> *)&stack0x00000008;
  local_468[4] = 0.06943184420297371;
  local_468[5] = 0.33000947820757187;
  local_468[6] = 0.6699905217924281;
  local_468[7] = 0.9305681557970263;
  local_468[0] = 0.17392742256872692;
  local_468[1] = 0.32607257743127305;
  local_468[2] = 0.32607257743127305;
  local_468[3] = 0.17392742256872692;
  iVar6 = (int)((ulong)in_stack_fffffffffffffae0 >> 0x20);
  local_420 = in_XMM0_Qa;
  RVar2 = BoundingBox<3>::min(iVar6);
  RVar3 = BoundingBox<3>::max(iVar6);
  local_60 = &local_488;
  local_64 = 0;
  local_488 = RVar2;
  local_49c = 1;
  local_3dc = (int)in_RDI[4];
  local_3d8 = *in_RDI;
  local_1f8 = *in_RDI + 0x18;
  local_1fc = local_3dc;
  dVar5 = *(double *)(local_1f8 + (long)local_3dc * 8);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    for (local_4a0 = 0; local_4a0 < (int)in_RDI[3]; local_4a0 = local_4a0 + 1) {
      for (local_4a4 = 0; local_4a4 < 3; local_4a4 = local_4a4 + 1) {
        local_3f8 = in_RDI + 2;
        local_3fc = local_4a4;
        if ((*(byte *)((long)(in_RDI + 2) + (long)local_4a4) & 1) == 0) {
          local_20 = (long)in_RDI + 0x13;
          local_24 = local_4a0;
          local_3b8 = local_20 + local_4a0;
          local_3bc = local_4a4;
          RVar4 = BoundingBox<3>::operator()
                            (this_00,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
          local_348 = this_00;
          local_34c = local_4a4;
          *(Real *)(this_00 + (long)local_4a4 * 8) = RVar4;
        }
      }
      local_358 = this_00;
      local_35c = (int)in_RDI[4];
      *(Real *)(this_00 + (long)(int)in_RDI[4] * 8) = RVar2;
      local_328 = (double *)*in_RDI;
      local_330 = this_00;
      local_298 = this_00;
      local_29c = 0;
      local_2a8 = local_328;
      local_2ac = 0;
      local_2b8 = local_328 + 3;
      local_2bc = 0;
      local_2c8 = this_00;
      local_2cc = 1;
      local_2d8 = local_328;
      local_2dc = 1;
      local_2e8 = local_328 + 3;
      local_2ec = 1;
      local_2f8 = this_00;
      local_2fc = 2;
      local_308 = local_328;
      local_30c = 2;
      local_318 = local_328 + 3;
      local_31c = 2;
      local_368 = this_00;
      local_36c = (int)in_RDI[4];
      local_3ec = (int)in_RDI[4];
      local_3e8 = *in_RDI;
      local_1e8 = *in_RDI + 0x18;
      local_1ec = local_3ec;
      dVar5 = *(double *)(this_00 + (long)(int)in_RDI[4] * 8) -
              ((*(double *)(this_00 + 0x10) - local_328[2]) * local_328[5] +
              (*(double *)this_00 - *local_328) * local_328[3] +
              (*(double *)(this_00 + 8) - local_328[1]) * local_328[4]) /
              *(double *)(local_1e8 + (long)local_3ec * 8);
      if ((RVar2 < dVar5) && (dVar5 < RVar3)) {
        local_70 = &local_488;
        local_74 = local_49c;
        (&local_488)[local_49c] = dVar5;
        local_49c = local_49c + 1;
      }
    }
  }
  if (local_49c == 3) {
    local_80 = &local_488;
    local_84 = 1;
    local_90 = &local_488;
    local_94 = 2;
    if (local_478[0] < local_480) {
      local_a0 = &local_488;
      local_a4 = 1;
      local_b0 = &local_488;
      local_b4 = 2;
      local_8 = &local_480;
      local_10 = local_478;
      local_18 = local_480;
      local_480 = local_478[0];
    }
  }
  local_c0 = &local_488;
  local_c4 = local_49c;
  (&local_488)[local_49c] = RVar3;
  for (local_4c4 = 0; local_4c4 < local_49c; local_4c4 = local_4c4 + 1) {
    local_d0 = &local_488;
    local_d4 = local_4c4 + 1;
    local_e0 = &local_488;
    local_e4 = local_4c4;
    if (1.1102230246251565e-14 <= (&local_488)[local_4c4 + 1] - (&local_488)[local_4c4]) {
      local_4c5 = true;
      local_f0 = &local_488;
      local_f4 = local_4c4;
      local_100 = &local_488;
      local_104 = local_4c4 + 1;
      local_378 = this_00;
      local_37c = (int)in_RDI[4];
      *(double *)(this_00 + (long)(int)in_RDI[4] * 8) =
           ((&local_488)[local_4c4] + (&local_488)[local_4c4 + 1]) * 0.5;
      local_4cc = 0;
      while( true ) {
        uVar1 = in_stack_fffffffffffffb0c & 0xffffff;
        if (local_4cc < (int)in_RDI[3]) {
          uVar1 = CONCAT13(local_4c5,(int3)in_stack_fffffffffffffb0c);
        }
        in_stack_fffffffffffffb0c = uVar1;
        if ((char)(in_stack_fffffffffffffb0c >> 0x18) == '\0') break;
        for (local_4d0 = 0; local_4d0 < 3; local_4d0 = local_4d0 + 1) {
          local_408 = in_RDI + 2;
          local_40c = local_4d0;
          if ((*(byte *)((long)(in_RDI + 2) + (long)local_4d0) & 1) == 0) {
            local_30 = (long)in_RDI + 0x13;
            local_34 = local_4cc;
            local_3c8 = local_30 + local_4cc;
            local_3cc = local_4d0;
            RVar2 = BoundingBox<3>::operator()
                              (this_00,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
            local_388 = this_00;
            local_38c = local_4d0;
            *(Real *)(this_00 + (long)local_4d0 * 8) = RVar2;
          }
        }
        local_338 = (double *)*in_RDI;
        local_340 = this_00;
        local_208 = this_00;
        local_20c = 0;
        local_218 = local_338;
        local_21c = 0;
        local_228 = local_338 + 3;
        local_22c = 0;
        local_238 = this_00;
        local_23c = 1;
        local_248 = local_338;
        local_24c = 1;
        local_258 = local_338 + 3;
        local_25c = 1;
        local_268 = this_00;
        local_26c = 2;
        local_278 = local_338;
        local_27c = 2;
        local_288 = local_338 + 3;
        local_28c = 2;
        if ((*(double *)(this_00 + 0x10) - local_338[2]) * local_338[5] +
            (*(double *)this_00 - *local_338) * local_338[3] +
            (*(double *)(this_00 + 8) - local_338[1]) * local_338[4] <= 0.0) {
          local_50 = (long)in_RDI + 0x13;
          local_54 = local_4cc;
          local_3b0 = (byte *)((long)in_RDI + 0x13 + (long)local_4cc);
          if ((*local_3b0 & 8) == 0) {
            local_514 = -1;
            if ((*local_3b0 & 0x10) != 0) {
              local_514 = 1;
            }
          }
          else {
            local_514 = 0;
          }
          local_505 = local_514 < 1;
        }
        else {
          local_40 = (long)in_RDI + 0x13;
          local_44 = local_4cc;
          local_3a8 = (byte *)((long)in_RDI + 0x13 + (long)local_4cc);
          if ((*local_3a8 & 8) == 0) {
            local_504 = -1;
            if ((*local_3a8 & 0x10) != 0) {
              local_504 = 1;
            }
          }
          else {
            local_504 = 0;
          }
          local_505 = -1 < local_504;
        }
        local_515 = false;
        if (local_4c5 != false) {
          local_515 = local_505;
        }
        local_4c5 = local_515;
        local_4cc = local_4cc + 1;
      }
      if (local_4c5 != false) {
        for (local_4d8 = 0; local_4d8 < 4; local_4d8 = local_4d8 + 1) {
          local_110 = &local_488;
          local_114 = local_4c4;
          local_120 = &local_488;
          local_124 = local_4c4 + 1;
          local_130 = &local_488;
          local_134 = local_4c4;
          local_398 = this_00;
          local_39c = (int)in_RDI[4];
          *(double *)(this_00 + (long)(int)in_RDI[4] * 8) =
               ((&local_488)[local_4c4 + 1] - (&local_488)[local_4c4]) *
               local_468[(long)local_4d8 + 4] + (&local_488)[local_4c4];
          local_140 = &local_488;
          local_144 = local_4c4 + 1;
          local_150 = &local_488;
          local_154 = local_4c4;
          local_1d0 = (int *)in_RDI[1];
          local_1e0 = local_420 *
                      ((&local_488)[local_4c4 + 1] - (&local_488)[local_4c4]) * local_468[local_4d8]
          ;
          local_1d8 = this_00;
          local_1a0 = this_00;
          local_1a4 = 0;
          local_160 = local_1d0 + 2;
          local_164 = *local_1d0;
          *(undefined8 *)(local_1d0 + 2 + (long)*local_1d0 * 8) = *(undefined8 *)this_00;
          local_1b0 = this_00;
          local_1b4 = 1;
          local_170 = local_1d0 + 2;
          local_174 = *local_1d0;
          *(undefined8 *)(local_1d0 + 2 + (long)*local_1d0 * 8 + 2) = *(undefined8 *)(this_00 + 8);
          local_1c0 = this_00;
          local_1c4 = 2;
          local_180 = local_1d0 + 2;
          local_184 = *local_1d0;
          *(undefined8 *)(local_1d0 + 2 + (long)*local_1d0 * 8 + 4) =
               *(undefined8 *)(this_00 + 0x10);
          local_190 = local_1d0 + 2;
          local_194 = *local_1d0;
          *(double *)(local_1d0 + 2 + (long)*local_1d0 * 8 + 6) = local_1e0;
          *local_1d0 = *local_1d0 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    void evalIntegrand (GpuArray<Real,N> x, Real w) const noexcept
    {
        constexpr Real gauss_x[4]={0.069431844202973712388026755553595247452_rt,
                                   0.33000947820757186759866712044837765640_rt,
                                   0.66999052179242813240133287955162234360_rt,
                                   0.93056815579702628761197324444640475255_rt};
        constexpr Real gauss_w[4]={0.173927422568726928686531974610999703618_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.173927422568726928686531974610999703618_rt};

        // Each thread has its own storage for computing roots. These
        // are not corrupted by the recursive chain of evalIntegrand()
        // calls since each call is in a different templated
        // namespace. Moreover, if using OpenMP tasking, each task is
        // assumed tied and so one thread can only execute
        // "evalIntegrand" from start to end uninterrupted.
        GpuArray<Real,4> roots;

        // Surface integral
        if (S)
        {
            AMREX_ASSERT(M == N && N >= 2); // x is thus valid in all variables except e0

            Real x_min = xrange.min(e0);
            Real x_max = xrange.max(e0);
            int nroots = 0;

            x[e0] = x_min;
            Real phi_lo = phi(x);
            Real xroot = x[e0] - phi_lo / phi.grad(e0);
            if (xroot > x_min && xroot < x_max) {
                roots[nroots++] = xroot;
            }

            AMREX_ASSERT(nroots <= 1);

            for (int i = 0; i < nroots; ++i)
            {
                x[e0] = roots[i];
                Real mag = 0._rt;
                for (int dim = 0; dim < N; ++dim) {
                    mag += phi.grad(dim)*phi.grad(dim);
                }
                mag = std::sqrt(mag);
                f.evalIntegrand(x, (mag/amrex::Math::abs(phi.grad(e0)))*w);
            }

            return;
        }

        // Partition [xmin(e0), xmax(e0)] by roots found
        Real x_min = xrange.min(e0);
        Real x_max = xrange.max(e0);
        roots[0] = x_min;
        int nroots = 1;
        if (phi.grad(e0) != Real(0.0)) {
            for (int i = 0; i < psiCount; ++i)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[i].side(dim),dim);
                    }
                }
                // x is now valid in all variables except e0
                x[e0] = x_min;
                Real phi_lo = phi(x);
                Real xroot = x[e0] - phi_lo / phi.grad(e0);
                if (xroot > x_min && xroot < x_max) {
                    roots[nroots++] = xroot;
                }
            }
            AMREX_ASSERT(nroots <= 3);
        }
        if (nroots == 3 && roots[1] > roots[2]) {
            detail::swap(roots[1],roots[2]);
        }
        roots[nroots++] = x_max;

        // In rare cases, degenerate segments can be found, filter out with a tolerance
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        constexpr Real tol = 50.0*eps;

        // Loop over segments of divided interval
        for (int i = 0; i < nroots - 1; ++i)
        {
            if (roots[i+1] - roots[i] < tol) continue;

            // Evaluate sign of phi within segment and check for consistency with psi
            bool okay = true;
            x[e0] = (roots[i] + roots[i+1])*0.5;
            for (int j = 0; j < psiCount && okay; ++j)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[j].side(dim), dim);
                    }
                }
                bool new_ok = (phi(x) > 0.0) ? (psi[j].sign() >= 0) : (psi[j].sign() <= 0);
                okay = okay && new_ok;
            }
            if (!okay) continue;

            for (int j = 0; j < p; ++j)
            {
                x[e0] = roots[i] + (roots[i+1] - roots[i]) * gauss_x[j];
                Real gw = (roots[i+1] - roots[i]) * gauss_w[j];
                f.evalIntegrand(x, w * gw);
            }
        }
    }